

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

redisAsyncContext * redisAsyncInitialize(redisContext *c)

{
  dict *pdVar1;
  redisAsyncContext *ac;
  redisContext *c_local;
  
  c_local = (redisContext *)realloc(c,0x1b8);
  if (c_local == (redisContext *)0x0) {
    c_local = (redisContext *)0x0;
  }
  else {
    c_local->flags = c_local->flags & 0xfffffffd;
    c_local[1].errstr[0x1c] = '\0';
    c_local[1].errstr[0x1d] = '\0';
    c_local[1].errstr[0x1e] = '\0';
    c_local[1].errstr[0x1f] = '\0';
    c_local[1].errstr[0x24] = '\0';
    c_local[1].errstr[0x25] = '\0';
    c_local[1].errstr[0x26] = '\0';
    c_local[1].errstr[0x27] = '\0';
    c_local[1].errstr[0x28] = '\0';
    c_local[1].errstr[0x29] = '\0';
    c_local[1].errstr[0x2a] = '\0';
    c_local[1].errstr[0x2b] = '\0';
    c_local[1].errstr[0x2c] = '\0';
    c_local[1].errstr[0x2d] = '\0';
    c_local[1].errstr[0x2e] = '\0';
    c_local[1].errstr[0x2f] = '\0';
    c_local[1].errstr[0x30] = '\0';
    c_local[1].errstr[0x31] = '\0';
    c_local[1].errstr[0x32] = '\0';
    c_local[1].errstr[0x33] = '\0';
    c_local[1].errstr[0x34] = '\0';
    c_local[1].errstr[0x35] = '\0';
    c_local[1].errstr[0x36] = '\0';
    c_local[1].errstr[0x37] = '\0';
    c_local[1].errstr[0x38] = '\0';
    c_local[1].errstr[0x39] = '\0';
    c_local[1].errstr[0x3a] = '\0';
    c_local[1].errstr[0x3b] = '\0';
    c_local[1].errstr[0x3c] = '\0';
    c_local[1].errstr[0x3d] = '\0';
    c_local[1].errstr[0x3e] = '\0';
    c_local[1].errstr[0x3f] = '\0';
    c_local[1].errstr[0x40] = '\0';
    c_local[1].errstr[0x41] = '\0';
    c_local[1].errstr[0x42] = '\0';
    c_local[1].errstr[0x43] = '\0';
    c_local[1].errstr[0x44] = '\0';
    c_local[1].errstr[0x45] = '\0';
    c_local[1].errstr[0x46] = '\0';
    c_local[1].errstr[0x47] = '\0';
    c_local[1].errstr[0x48] = '\0';
    c_local[1].errstr[0x49] = '\0';
    c_local[1].errstr[0x4a] = '\0';
    c_local[1].errstr[0x4b] = '\0';
    c_local[1].errstr[0x4c] = '\0';
    c_local[1].errstr[0x4d] = '\0';
    c_local[1].errstr[0x4e] = '\0';
    c_local[1].errstr[0x4f] = '\0';
    c_local[1].errstr[0x50] = '\0';
    c_local[1].errstr[0x51] = '\0';
    c_local[1].errstr[0x52] = '\0';
    c_local[1].errstr[0x53] = '\0';
    c_local[1].errstr[0x54] = '\0';
    c_local[1].errstr[0x55] = '\0';
    c_local[1].errstr[0x56] = '\0';
    c_local[1].errstr[0x57] = '\0';
    c_local[1].errstr[0x58] = '\0';
    c_local[1].errstr[0x59] = '\0';
    c_local[1].errstr[0x5a] = '\0';
    c_local[1].errstr[0x5b] = '\0';
    c_local[1].errstr[0x5c] = '\0';
    c_local[1].errstr[0x5d] = '\0';
    c_local[1].errstr[0x5e] = '\0';
    c_local[1].errstr[0x5f] = '\0';
    c_local[1].errstr[0x60] = '\0';
    c_local[1].errstr[0x61] = '\0';
    c_local[1].errstr[0x62] = '\0';
    c_local[1].errstr[99] = '\0';
    c_local[1].errstr[100] = '\0';
    c_local[1].errstr[0x65] = '\0';
    c_local[1].errstr[0x66] = '\0';
    c_local[1].errstr[0x67] = '\0';
    c_local[1].errstr[0x68] = '\0';
    c_local[1].errstr[0x69] = '\0';
    c_local[1].errstr[0x6a] = '\0';
    c_local[1].errstr[0x6b] = '\0';
    c_local[1].errstr[0x74] = '\0';
    c_local[1].errstr[0x75] = '\0';
    c_local[1].errstr[0x76] = '\0';
    c_local[1].errstr[0x77] = '\0';
    c_local[1].errstr[0x78] = '\0';
    c_local[1].errstr[0x79] = '\0';
    c_local[1].errstr[0x7a] = '\0';
    c_local[1].errstr[0x7b] = '\0';
    c_local[1].errstr[0x6c] = '\0';
    c_local[1].errstr[0x6d] = '\0';
    c_local[1].errstr[0x6e] = '\0';
    c_local[1].errstr[0x6f] = '\0';
    c_local[1].errstr[0x70] = '\0';
    c_local[1].errstr[0x71] = '\0';
    c_local[1].errstr[0x72] = '\0';
    c_local[1].errstr[0x73] = '\0';
    *(undefined8 *)(c_local[1].errstr + 0x7c) = 0;
    *(undefined8 *)&c_local[1].flags = 0;
    *(undefined8 *)&c_local[1].connection_type = 0;
    c_local[1].timeout = (timeval *)0x0;
    pdVar1 = dictCreate(&callbackDict,(void *)0x0);
    c_local[1].tcp.host = (char *)pdVar1;
    pdVar1 = dictCreate(&callbackDict,(void *)0x0);
    c_local[1].tcp.source_addr = (char *)pdVar1;
    pthread_mutex_init((pthread_mutex_t *)(c_local + 1),(pthread_mutexattr_t *)0x0);
  }
  return (redisAsyncContext *)c_local;
}

Assistant:

static redisAsyncContext *redisAsyncInitialize(redisContext *c) {
    redisAsyncContext *ac;

    ac = realloc(c,sizeof(redisAsyncContext));
    if (ac == NULL)
        return NULL;

    c = &(ac->c);

    /* The regular connect functions will always set the flag REDIS_CONNECTED.
     * For the async API, we want to wait until the first write event is
     * received up before setting this flag, so reset it here. */
    c->flags &= ~REDIS_CONNECTED;

    ac->err = 0;
    ac->errstr = NULL;
    ac->data = NULL;

    ac->ev.data = NULL;
    ac->ev.addRead = NULL;
    ac->ev.delRead = NULL;
    ac->ev.addWrite = NULL;
    ac->ev.delWrite = NULL;
    ac->ev.cleanup = NULL;
    ac->ev.scheduleTimer = NULL;

    ac->onConnect = NULL;
    ac->onDisconnect = NULL;

    ac->replies.head = NULL;
    ac->replies.tail = NULL;
    ac->sub.invalid.head = NULL;
    ac->sub.invalid.tail = NULL;
    ac->sub.channels = dictCreate(&callbackDict,NULL);
    ac->sub.patterns = dictCreate(&callbackDict,NULL);
    pthread_mutex_init(&ac->ctxlock, NULL);
    return ac;
}